

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *interfaceNode)

{
  uint *__return_storage_ptr__;
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  ulong size;
  bool *pbVar4;
  size_t __n;
  uint64_t uVar5;
  Iterator IVar6;
  ArrayPtr<bool> AVar7;
  Iterator IVar8;
  ArrayPtr<const_char> name;
  byte local_3a1;
  Reader local_328;
  Reader local_2f8;
  int local_2c4;
  Fault local_2c0;
  Fault f;
  DebugComparison<unsigned_short,_unsigned_int> local_2b0;
  bool local_289;
  undefined1 auStack_288 [7];
  bool _kjCondition;
  size_t sStack_280;
  ArrayPtr<const_char> local_278;
  undefined1 local_260 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:438:7)>
  _kjContext438;
  anon_class_8_1_60e9c21f _kjContextFunc438;
  Reader method;
  undefined1 local_1c8 [8];
  Iterator __end2_1;
  undefined1 local_1a8 [8];
  Iterator __begin2_1;
  Reader *__range2_1;
  uint index;
  undefined1 local_180 [8];
  ArrayPtr<bool> sawCodeOrder;
  Array<bool> sawCodeOrder_heap;
  bool sawCodeOrder_stack [32];
  bool sawCodeOrder_isOnStack;
  size_t sawCodeOrder_size;
  Reader methods;
  undefined1 local_c0 [8];
  Reader extend;
  undefined1 local_80 [8];
  Iterator __end2;
  undefined1 local_60 [8];
  Iterator __begin2;
  Reader *__range2;
  Reader *interfaceNode_local;
  Validator *this_local;
  
  __return_storage_ptr__ = &__begin2.index;
  capnp::schema::Node::Interface::Reader::getSuperclasses
            ((Reader *)__return_storage_ptr__,interfaceNode);
  IVar6 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)__return_storage_ptr__);
  __end2._8_8_ = IVar6.container;
  __begin2.container._0_4_ = IVar6.index;
  local_60 = (undefined1  [8])__end2._8_8_;
  IVar6 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::end
                    ((Reader *)__return_storage_ptr__);
  extend._reader._40_8_ = IVar6.container;
  __end2.container._0_4_ = IVar6.index;
  local_80 = (undefined1  [8])extend._reader._40_8_;
  while (bVar1 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                 ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                               *)local_60,
                              (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                               *)local_80), ((bVar1 ^ 0xffU) & 1) != 0) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator*((Reader *)local_c0,
                (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                 *)local_60);
    uVar5 = capnp::schema::Superclass::Reader::getId((Reader *)local_c0);
    validateTypeId(this,uVar5,INTERFACE);
    capnp::schema::Superclass::Reader::getBrand
              ((Reader *)&methods.reader.nestingLimit,(Reader *)local_c0);
    validate(this,(Reader *)&methods.reader.nestingLimit);
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                  *)local_60);
  }
  capnp::schema::Node::Interface::Reader::getMethods((Reader *)&sawCodeOrder_size,interfaceNode);
  uVar3 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
  size = (ulong)uVar3;
  if (size < 0x21) {
    kj::Array<bool>::Array((Array<bool> *)&sawCodeOrder.size_,(void *)0x0);
    AVar7 = kj::arrayPtr<bool>((bool *)&sawCodeOrder_heap.disposer,size);
  }
  else {
    kj::heapArray<bool>((Array<bool> *)&sawCodeOrder.size_,size);
    AVar7 = kj::Array::operator_cast_to_ArrayPtr((Array *)&sawCodeOrder.size_);
  }
  sawCodeOrder.ptr = (bool *)AVar7.size_;
  local_180 = (undefined1  [8])AVar7.ptr;
  pbVar4 = kj::ArrayPtr<bool>::begin((ArrayPtr<bool> *)local_180);
  __n = kj::ArrayPtr<bool>::size((ArrayPtr<bool> *)local_180);
  memset(pbVar4,0,__n);
  __range2_1._0_4_ = 0;
  __begin2_1._8_8_ = &sawCodeOrder_size;
  IVar8 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::begin((Reader *)__begin2_1._8_8_);
  __end2_1._8_8_ = IVar8.container;
  __begin2_1.container._0_4_ = IVar8.index;
  local_1a8 = (undefined1  [8])__end2_1._8_8_;
  IVar8 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::end((Reader *)__begin2_1._8_8_);
  local_1c8 = (undefined1  [8])IVar8.container;
  __end2_1.container._0_4_ = IVar8.index;
  while( true ) {
    bVar1 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                          *)local_1a8,
                         (IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                          *)local_1c8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
    ::operator*((Reader *)&_kjContextFunc438,
                (IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                 *)local_1a8);
    _kjContext438.func = &_kjContextFunc438;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:438:7)>
    ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:438:7)>
                   *)local_260,(anon_class_8_1_60e9c21f *)&_kjContext438.func);
    name = (ArrayPtr<const_char>)
           capnp::schema::Method::Reader::getName((Reader *)&_kjContextFunc438);
    _auStack_288 = name;
    local_278 = name;
    validateMemberName(this,(StringPtr)name,(uint)__range2_1);
    f.exception._4_2_ = capnp::schema::Method::Reader::getCodeOrder((Reader *)&_kjContextFunc438);
    f.exception._6_2_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (unsigned_short *)((long)&f.exception + 4));
    f.exception._0_4_ =
         List<capnp::schema::Method,_(capnp::Kind)3>::Reader::size((Reader *)&sawCodeOrder_size);
    kj::_::DebugExpression<unsigned_short>::operator<
              (&local_2b0,(DebugExpression<unsigned_short> *)((long)&f.exception + 6),(uint *)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_2b0);
    local_3a1 = 0;
    if (bVar1) {
      uVar2 = capnp::schema::Method::Reader::getCodeOrder((Reader *)&_kjContextFunc438);
      pbVar4 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)local_180,(ulong)uVar2);
      local_3a1 = *pbVar4 ^ 0xff;
    }
    local_289 = (bool)(local_3a1 & 1);
    if (local_289 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18]>
                (&local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x1bb,FAILED,
                 "method.getCodeOrder() < methods.size() && !sawCodeOrder[method.getCodeOrder()]",
                 "_kjCondition,\"invalid codeOrder\"",&local_289,(char (*) [18])"invalid codeOrder")
      ;
      this->isValid = false;
      local_2c4 = 1;
      kj::_::Debug::Fault::~Fault(&local_2c0);
    }
    else {
      uVar2 = capnp::schema::Method::Reader::getCodeOrder((Reader *)&_kjContextFunc438);
      pbVar4 = kj::ArrayPtr<bool>::operator[]((ArrayPtr<bool> *)local_180,(ulong)uVar2);
      *pbVar4 = true;
      uVar5 = capnp::schema::Method::Reader::getParamStructType((Reader *)&_kjContextFunc438);
      validateTypeId(this,uVar5,STRUCT);
      capnp::schema::Method::Reader::getParamBrand(&local_2f8,(Reader *)&_kjContextFunc438);
      validate(this,&local_2f8);
      uVar5 = capnp::schema::Method::Reader::getResultStructType((Reader *)&_kjContextFunc438);
      validateTypeId(this,uVar5,STRUCT);
      capnp::schema::Method::Reader::getResultBrand(&local_328,(Reader *)&_kjContextFunc438);
      validate(this,&local_328);
      local_2c4 = 0;
    }
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:438:7)>
    ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:438:7)>
                    *)local_260);
    if (local_2c4 != 0) goto LAB_002c7eb8;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                  *)local_1a8);
    __range2_1._0_4_ = (uint)__range2_1 + 1;
  }
  local_2c4 = 0;
LAB_002c7eb8:
  kj::Array<bool>::~Array((Array<bool> *)&sawCodeOrder.size_);
  return;
}

Assistant:

void validate(const schema::Node::Interface::Reader& interfaceNode) {
    for (auto extend: interfaceNode.getSuperclasses()) {
      validateTypeId(extend.getId(), schema::Node::INTERFACE);
      validate(extend.getBrand());
    }

    auto methods = interfaceNode.getMethods();
    KJ_STACK_ARRAY(bool, sawCodeOrder, methods.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto method: methods) {
      KJ_CONTEXT("validating method", method.getName());
      validateMemberName(method.getName(), index++);

      VALIDATE_SCHEMA(method.getCodeOrder() < methods.size() &&
                      !sawCodeOrder[method.getCodeOrder()],
                      "invalid codeOrder");
      sawCodeOrder[method.getCodeOrder()] = true;

      validateTypeId(method.getParamStructType(), schema::Node::STRUCT);
      validate(method.getParamBrand());
      validateTypeId(method.getResultStructType(), schema::Node::STRUCT);
      validate(method.getResultBrand());
    }
  }